

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::BitfieldExtractCase::getInputValues
          (BitfieldExtractCase *this,int numValues,void **values)

{
  ShaderType shaderType;
  Precision dataType;
  pointer pSVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  deUint32 dVar5;
  uint uVar6;
  uint uVar7;
  int in_R9D;
  ulong uVar8;
  Random rnd;
  deRandom local_40;
  
  dVar5 = deStringHash((this->super_IntegerFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar5 ^ 0xa113fca2);
  pSVar1 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  shaderType = (pSVar1->varType).m_data.basic.type;
  dataType = (pSVar1->varType).m_data.basic.precision;
  pvVar2 = *values;
  if (0 < numValues) {
    pvVar3 = values[1];
    pvVar4 = values[2];
    uVar6 = (*(int *)(&DAT_01c96080 + (ulong)dataType * 4) -
            (uint)(shaderType - 0x1b < 4 && (ulong)dataType != 2)) + 1;
    uVar8 = 0;
    do {
      dVar5 = deRandom_getUint32(&local_40);
      uVar7 = dVar5 % uVar6;
      dVar5 = deRandom_getUint32(&local_40);
      *(uint *)((long)pvVar3 + uVar8 * 4) = dVar5 % (uVar6 - uVar7);
      *(uint *)((long)pvVar4 + uVar8 * 4) = uVar7;
      uVar8 = uVar8 + 1;
    } while ((uint)numValues != uVar8);
  }
  anon_unknown_3::generateRandomInputData
            ((Random *)&local_40,shaderType,dataType,(Precision)pvVar2,
             (deUint32 *)(ulong)(uint)numValues,in_R9D);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(getName()) ^ 0xa113fca2u);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const bool				ignoreSign	= precision != glu::PRECISION_HIGHP && glu::isDataTypeIntOrIVec(type);
		const int				numBits		= getShaderUintBitCount(m_shaderType, precision) - (ignoreSign ? 1 : 0);
		deUint32*				inValue		= (deUint32*)values[0];
		int*					inOffset	= (int*)values[1];
		int*					inBits		= (int*)values[2];

		for (int valueNdx = 0; valueNdx < numValues; ++valueNdx)
		{
			const int		bits	= rnd.getInt(0, numBits);
			const int		offset	= rnd.getInt(0, numBits-bits);

			inOffset[valueNdx]	= offset;
			inBits[valueNdx]	= bits;
		}

		generateRandomInputData(rnd, m_shaderType, type, precision, inValue, numValues);
	}